

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CbQueue.cpp
# Opt level: O0

void __thiscall Hpipe::CbQueue::write_some(CbQueue *this,CbQueue *cq)

{
  Buffer *pBVar1;
  Buffer *n;
  CbQueue *cq_local;
  CbQueue *this_local;
  
  if (cq->off != 0) {
    write_some(this,cq->beg->data + cq->off,cq->beg->used - (ulong)cq->off);
    pBVar1 = cq->beg->next;
    Buffer::dec_ref(cq->beg);
    cq->beg = pBVar1;
  }
  if (this->beg == (Buffer *)0x0) {
    this->beg = cq->beg;
    this->off = 0;
  }
  else {
    this->end->next = cq->beg;
  }
  this->end = cq->end;
  CbQueue(cq);
  return;
}

Assistant:

void CbQueue::write_some( CbQueue &&cq ) {
    if ( cq.off ) {
        write_some( cq.beg->data + cq.off, cq.beg->used - cq.off );
        Buffer *n = cq.beg->next;
        Buffer::dec_ref( cq.beg );
        cq.beg = n;
    }

    if ( not beg ) {
        beg = cq.beg;
        off = 0;
    } else {
        end->next = cq.beg;
    }
    end = cq.end;

    // we don't want to dec_ref the buffers of cq (which are now used in this)
    new ( &cq ) CbQueue;
}